

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O2

void clear_all_objects_selected(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object current;
  Am_Value_List all_objects;
  
  Am_Object::Get_Owner(&current,(Am_Slot_Flags)inter);
  pAVar2 = Am_Object::Get(&current,0x82,0);
  Am_Value_List::Am_Value_List(&all_objects,pAVar2);
  Am_Object::~Am_Object(&current);
  current.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&all_objects);
  while( true ) {
    bVar1 = Am_Value_List::Last(&all_objects);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&all_objects);
    Am_Object::operator=(&current,pAVar2);
    Am_Object::Set(&current,0x172,false,1);
    Am_Value_List::Next(&all_objects);
  }
  Am_Object::~Am_Object(&current);
  Am_Value_List::~Am_Value_List(&all_objects);
  return;
}

Assistant:

void
clear_all_objects_selected(Am_Object &inter)
{
  Am_Value_List all_objects = inter.Get_Owner().Get(Am_GRAPHICAL_PARTS);
  Am_Object current;
  for (all_objects.Start(); !all_objects.Last(); all_objects.Next()) {
    current = all_objects.Get();
    Am_REPORT_SET_SEL_VALUE(true, inter, current, false);
    current.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
  }
}